

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

bool deqp::gls::pixelNearEdge(int x,int y,Surface *ref,IVec3 *renderTargetThreshold)

{
  bool bVar1;
  RGBA local_48;
  RGBA local_44;
  RGBA c3_1;
  RGBA c2_1;
  RGBA c1_1;
  int dx;
  RGBA c3;
  RGBA c2;
  RGBA c1;
  int dy;
  IVec3 *renderTargetThreshold_local;
  Surface *ref_local;
  int y_local;
  int x_local;
  
  for (c2.m_value = 0xffffffff; (int)c2.m_value < 2; c2.m_value = c2.m_value + 1) {
    c3 = tcu::Surface::getPixel(ref,x + -1,y + c2.m_value);
    dx = (int)tcu::Surface::getPixel(ref,x,y + c2.m_value);
    c1_1 = tcu::Surface::getPixel(ref,x + 1,y + c2.m_value);
    bVar1 = isEdgeTriplet(&c3,(RGBA *)&dx,&c1_1,renderTargetThreshold);
    if (bVar1) {
      return true;
    }
  }
  c2_1.m_value = 0xffffffff;
  while( true ) {
    if (1 < (int)c2_1.m_value) {
      return false;
    }
    c3_1 = tcu::Surface::getPixel(ref,x + c2_1.m_value,y + -1);
    local_44 = tcu::Surface::getPixel(ref,x + c2_1.m_value,y);
    local_48 = tcu::Surface::getPixel(ref,x + c2_1.m_value,y + 1);
    bVar1 = isEdgeTriplet(&c3_1,&local_44,&local_48,renderTargetThreshold);
    if (bVar1) break;
    c2_1.m_value = c2_1.m_value + 1;
  }
  return true;
}

Assistant:

static bool pixelNearEdge (int x, int y, const tcu::Surface& ref, const tcu::IVec3& renderTargetThreshold)
{
	// should not be called for edge pixels
	DE_ASSERT(x >= 1 && x <= ref.getWidth()-2);
	DE_ASSERT(y >= 1 && y <= ref.getHeight()-2);

	// horizontal

	for (int dy = -1; dy < 2; ++dy)
	{
		const tcu::RGBA c1 = ref.getPixel(x-1, y+dy);
		const tcu::RGBA c2 = ref.getPixel(x,   y+dy);
		const tcu::RGBA c3 = ref.getPixel(x+1, y+dy);
		if (isEdgeTriplet(c1, c2, c3, renderTargetThreshold))
			return true;
	}

	// vertical

	for (int dx = -1; dx < 2; ++dx)
	{
		const tcu::RGBA c1 = ref.getPixel(x+dx, y-1);
		const tcu::RGBA c2 = ref.getPixel(x+dx, y);
		const tcu::RGBA c3 = ref.getPixel(x+dx, y+1);
		if (isEdgeTriplet(c1, c2, c3, renderTargetThreshold))
			return true;
	}

	return false;
}